

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

void __thiscall std::pmr::test_resource::~test_resource(test_resource *this)

{
  ~test_resource(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

test_resource::~test_resource()
{
    if (is_verbose()) {
        print();
    }

    Link *link_p = m_list_->d_head_p;
    while (link_p) {
        Link *linkToFree = link_p;
        link_p = link_p->m_next_;
        m_pmr_->deallocate(linkToFree, sizeof(Link), alignof(Link));
    }
    m_list_->d_head_p = nullptr;
    m_list_->d_tail_p = nullptr;
    m_pmr_->deallocate(m_list_,
                       sizeof(test_resource_list),
                       alignof(test_resource_list));

    if (!is_quiet()) {
        if (bytes_in_use() || blocks_in_use()) {
            printf("MEMORY_LEAK");
            if (!m_name_.empty()) {
                printf(" from %.*s",
                       static_cast<int>(m_name_.length()), m_name_.data());
            }
            printf(":\n  Number of blocks in use = %lld\n"
                   "   Number of bytes in use = %lld\n",
                   blocks_in_use(), bytes_in_use());

            if (!is_no_abort()) {
                std::abort();                                          // ABORT
            }
        }
    }
}